

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<0> *this,State *state)

{
  int band_idx;
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  State state_copy;
  State local_240;
  
  auVar5 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][0].configurations.vec);
  auVar6 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][1].configurations.vec);
  auVar9._8_8_ = 0xf000e00040000;
  auVar9._0_8_ = 0xf000e00040000;
  auVar8 = vpunpcklqdq_avx(auVar5,auVar6);
  auVar5 = vpunpckhqdq_avx(auVar5,auVar6);
  auVar7 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][2].configurations.vec);
  auVar5 = vpaddq_avx(auVar8,auVar5);
  auVar8 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][0].configurations.vec);
  auVar6 = vpunpcklqdq_avx(auVar7,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar7,auVar8);
  auVar7 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][1].configurations.vec);
  auVar8 = vpaddq_avx(auVar6,auVar8);
  auVar6 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][2].configurations.vec);
  auVar11 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar1 = vpunpckhqdq_avx(auVar7,auVar6);
  auVar6 = vpcmpeqd_avx(auVar6,auVar6);
  auVar9 = vpermi2w_avx512vl(auVar9,auVar5,auVar6);
  auVar6 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar7 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar5 = vpaddq_avx(auVar11,auVar1);
  auVar8 = vpermi2w_avx512vl(auVar6,auVar9,auVar8);
  auVar5 = vpermi2w_avx512vl(auVar7,auVar8,auVar5);
  auVar8._8_2_ = 0xfff6;
  auVar8._0_8_ = 0xfff6fff6fff6fff6;
  auVar8._10_2_ = 0xfff6;
  auVar8._12_2_ = 0xfff6;
  auVar8._14_2_ = 0xfff6;
  auVar5 = vpaddw_avx(auVar5,auVar8);
  auVar5 = vphminposuw_avx(auVar5);
  if ((auVar5 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    uVar3 = (ulong)(auVar5._0_4_ >> 0x10);
    band_idx = *(int *)((anonymous_namespace)::tables + uVar3 * 4 + 0x18dc);
    auVar8 = *(undefined1 (*) [16])
              state->bands[*(int *)((anonymous_namespace)::tables + uVar3 * 4 + 0x18b8)][band_idx].
              configurations.vec;
    auVar6 = vpshufb_avx(auVar8,_DAT_0010aba0);
    auVar7 = vpblendd_avx2(auVar6,(undefined1  [16])0x0,8);
    auVar1 = vpshufb_avx(auVar6,_DAT_0010abb0);
    auVar6 = vpand_avx(auVar8,auVar7);
    auVar7 = vpor_avx(auVar8,auVar7);
    auVar11 = vpshufb_avx(auVar1,_DAT_0010aba0);
    auVar8 = vpand_avx(auVar6,auVar1);
    auVar10 = vpternlogq_avx512vl(auVar6,auVar7,auVar1,0xf8);
    auVar6 = vpor_avx(auVar7,auVar1);
    auVar9 = vpblendd_avx2(auVar11,(undefined1  [16])0x0,8);
    auVar7 = vpshufb_avx(auVar11,_DAT_0010abb0);
    auVar11 = vpternlogq_avx512vl(auVar8,auVar10,auVar9,0xf8);
    auVar10 = vpternlogq_avx512vl(auVar10,auVar6,auVar9,0xf8);
    auVar6 = vpor_avx(auVar6,auVar9);
    auVar1 = vpshufb_avx(auVar7,_DAT_0010abb0);
    auVar12 = vpternlogq_avx512vl(auVar11,auVar10,auVar7,0xf8);
    auVar10 = vpternlogq_avx512vl(auVar10,auVar6,auVar7,0xf8);
    auVar6 = vpor_avx(auVar6,auVar7);
    auVar13 = vpternlogq_avx512vl(auVar12,auVar10,auVar1,0xf8);
    auVar6 = vpternlogq_avx512vl(auVar6,auVar10,auVar1,0xec);
    if ((auVar6 & ~auVar13) == (undefined1  [16])0x0) {
      auVar6 = vpand_avx(auVar11,auVar7);
      auVar6 = vpternlogq_avx512vl(auVar6,auVar8,auVar9,0xf8);
      auVar6 = vpternlogq_avx512vl(auVar6,auVar12,auVar1,0xf8);
      if ((auVar13 & ~auVar6) != (undefined1  [16])0x0) {
        auVar6 = vpandn_avx(auVar6,auVar13);
      }
    }
    else {
      auVar6 = vpandn_avx(auVar13,auVar6);
    }
    auVar8 = vpcmpeqd_avx(auVar8,auVar8);
    auVar8 = vpsignw_avx(auVar6,auVar8);
    auVar8 = vpand_avx(auVar6,auVar8);
    sVar4 = this->num_guesses_ + 1;
    if (auVar5._0_4_ < 0x30000) {
      auVar5 = vpand_avx(auVar8,*(undefined1 (*) [16])state->bands[0][band_idx].configurations.vec);
      this->num_guesses_ = sVar4;
      State::State(&local_240,state);
      uVar3 = vpcmpgtq_avx512vl(auVar5,(undefined1  [16])0x0);
      auVar8 = vpcmpgtq_avx(auVar5,(undefined1  [16])0x0);
      auVar8 = vpslldq_avx(auVar8,1);
      auVar1._8_8_ = 1;
      auVar1._0_8_ = 1;
      auVar8 = vandnpd_avx512vl(auVar8,auVar1);
      auVar8 = vpsubq_avx512vl(auVar5,auVar8);
      bVar2 = (bool)((byte)(uVar3 & 3) & 1);
      auVar11._0_8_ = (ulong)bVar2 * auVar8._0_8_ | (ulong)!bVar2 * auVar5._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar11._8_8_ = uVar3 * auVar8._8_8_ | (ulong)!SUB81(uVar3,0) * auVar5._8_8_;
      auVar8 = vpand_avx(auVar11,auVar5);
      auVar6 = vpor_avx(auVar8,*(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec = auVar6;
      bVar2 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar2) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar5 = vpternlogq_avx512vl(auVar5,auVar8,
                                   *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec,
                                   0xbe);
      *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec = auVar5;
      bVar2 = BandEliminate<0>(state,band_idx,0);
    }
    else {
      auVar5 = vpand_avx(auVar8,*(undefined1 (*) [16])state->boxen[(long)band_idx + -3].cells.vec);
      this->num_guesses_ = sVar4;
      State::State(&local_240,state);
      uVar3 = vpcmpgtq_avx512vl(auVar5,(undefined1  [16])0x0);
      auVar8 = vpcmpgtq_avx(auVar5,(undefined1  [16])0x0);
      auVar8 = vpslldq_avx(auVar8,1);
      auVar6._8_8_ = 1;
      auVar6._0_8_ = 1;
      auVar8 = vandnpd_avx512vl(auVar8,auVar6);
      auVar8 = vpsubq_avx512vl(auVar5,auVar8);
      bVar2 = (bool)((byte)(uVar3 & 3) & 1);
      auVar7._0_8_ = (ulong)bVar2 * auVar8._0_8_ | (ulong)!bVar2 * auVar5._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar7._8_8_ = uVar3 * auVar8._8_8_ | (ulong)!SUB81(uVar3,0) * auVar5._8_8_;
      auVar8 = vpand_avx(auVar7,auVar5);
      auVar6 = vpor_avx(auVar8,*(undefined1 (*) [16])
                                (local_240.boxen[(long)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)band_idx + -3].cells.vec + 2) = auVar6;
      bVar2 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar2) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar5 = vpternlogq_avx512vl(auVar5,auVar8,
                                   *(undefined1 (*) [16])
                                    (state->boxen[(long)band_idx + -3].cells.vec + 2),0xbe);
      *(undefined1 (*) [16])(state->boxen[(long)band_idx + -3].cells.vec + 2) = auVar5;
      bVar2 = BandEliminate<1>(state,band_idx,0);
    }
    if (bVar2 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,state);
    }
  }
  else {
    this->num_solutions_ = this->num_solutions_ + 1;
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }